

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  unsigned_long uVar4;
  char *pcVar5;
  long *plVar6;
  ulong dindex;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  Directory dir;
  string m;
  string fullPath;
  string bdir;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  Directory local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  cmCoreTryCompile *local_88;
  long *local_80 [2];
  long local_70 [2];
  undefined1 local_60 [32];
  _Base_ptr local_40;
  size_t local_38;
  
  if (binDir != (char *)0x0) {
    local_80[0] = local_70;
    local_88 = this;
    sVar2 = strlen(binDir);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,binDir,binDir + sVar2);
    lVar3 = std::__cxx11::string::find((char *)local_80,0x65ca67,0);
    if (lVar3 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 binDir,(char *)0x0,(char *)0x0);
    }
    else {
      cmsys::Directory::Directory(&local_d0);
      local_60._0_8_ = local_60 + 0x10;
      sVar2 = strlen(binDir);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,binDir,binDir + sVar2);
      cmsys::Directory::Load(&local_d0,(string *)local_60);
      if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      local_60._24_8_ = local_60 + 8;
      local_60._8_4_ = _S_red;
      dindex = 0;
      local_60._16_8_ = 0;
      local_38 = 0;
      local_40 = (_Base_ptr)local_60._24_8_;
      while( true ) {
        uVar4 = cmsys::Directory::GetNumberOfFiles(&local_d0);
        if (uVar4 <= dindex) break;
        pcVar5 = cmsys::Directory::GetFile(&local_d0,dindex);
        if ((*pcVar5 != '.') || ((pcVar5[1] != '\0' && ((pcVar5[1] != '.' || (pcVar5[2] != '\0')))))
           ) {
          std::__cxx11::string::string((string *)&local_a8,pcVar5,(allocator *)&local_c8);
          pVar7 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_60,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            sVar2 = strlen(binDir);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,binDir,binDir + sVar2);
            pcVar5 = (char *)std::__cxx11::string::append((char *)&local_c8);
            plVar6 = (long *)std::__cxx11::string::append(pcVar5);
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a8,*plVar6,plVar6[1] + *plVar6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            bVar1 = cmsys::SystemTools::FileIsDirectory(&local_a8);
            if (bVar1) {
              CleanupFiles(local_88,local_a8._M_dataplus._M_p);
              cmsys::SystemTools::RemoveADirectory(&local_a8);
            }
            else {
              bVar1 = cmsys::SystemTools::RemoveFile(&local_a8);
              if (!bVar1) {
                std::operator+(&local_c8,"Remove failed on file: ",&local_a8);
                cmSystemTools::ReportLastSystemError(local_c8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
      cmsys::Directory::~Directory(&local_d0);
    }
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if (!binDir) {
    return;
  }

  std::string bdir = binDir;
  if (bdir.find("CMakeTmp") == std::string::npos) {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:",
      binDir);
    return;
  }

  cmsys::Directory dir;
  dir.Load(binDir);
  std::set<std::string> deletedFiles;
  for (unsigned long i = 0; i < dir.GetNumberOfFiles(); ++i) {
    const char* fileName = dir.GetFile(i);
    if (strcmp(fileName, ".") != 0 && strcmp(fileName, "..") != 0) {
      if (deletedFiles.insert(fileName).second) {
        std::string const fullPath =
          std::string(binDir).append("/").append(fileName);
        if (cmSystemTools::FileIsDirectory(fullPath)) {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
        } else {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while (!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                 --retry.Count &&
                 cmSystemTools::FileExists(fullPath.c_str())) {
            cmSystemTools::Delay(retry.Delay);
          }
          if (retry.Count == 0)
#else
          if (!cmSystemTools::RemoveFile(fullPath))
#endif
          {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
          }
        }
      }
    }
  }
}